

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

void __thiscall
capnp::compiler::CompilerMain::setRootType::CliArgumentErrorReporter::~CliArgumentErrorReporter
          (CliArgumentErrorReporter *this)

{
  (this->super_ErrorReporter)._vptr_ErrorReporter = (_func_int **)&PTR_StringPtr__002729a0;
  kj::_::NullableValue<kj::String>::~NullableValue(&(this->error).ptr);
  return;
}

Assistant:

void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
        if (startByte < endByte) {
          error = kj::str(startByte + 1, "-", endByte, ": ", message);
        } else if (startByte > 0) {
          error = kj::str(startByte + 1, ": ", message);
        } else {
          error = kj::str(message);
        }
      }